

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void snap_restoredata(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,
                     IRRef ref,void *dst,CTSize sz)

{
  char *pcVar1;
  IRIns *pIVar2;
  undefined4 in_register_0000000c;
  IRIns *pIVar3;
  undefined4 in_register_0000008c;
  IRIns *pIVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  pIVar4 = (IRIns *)CONCAT44(in_register_0000008c,ref);
  pIVar3 = (J->cur).ir;
  pIVar2 = pIVar3 + (rfilt & 0xffffffff);
  if ((uint)rfilt < 0x8000) {
    if (((pIVar2->field_1).o & 0xfe) == 0x1c) {
      pIVar3 = pIVar2 + 1;
    }
    else {
      pIVar3 = pIVar2;
      if ((int)dst == 8) {
LAB_00146e40:
        pIVar3 = (IRIns *)&stack0xffffffffffffffe0;
        goto LAB_00146e5f;
      }
    }
  }
  else {
    uVar5 = (uint)*(ushort *)((long)pIVar3 + (rfilt & 0xffffffff) * 8 + 6);
    if (((CONCAT44(in_register_0000000c,snapno) >> (rfilt & 0x3f) & 1) != 0) &&
       (uVar6 = (ulong)((J->cur).nins - 1), *(char *)((long)pIVar3 + uVar6 * 8 + 5) == '\x14')) {
      pIVar3 = pIVar3 + uVar6;
      do {
        if (((uint)(pIVar3->field_0).op1 == (uint)rfilt) &&
           ((uint)(pIVar3->field_0).op2 <= (uint)ex)) {
          uVar5 = (uint)(pIVar3->field_0).prev;
        }
        pcVar1 = (char *)((long)pIVar3 + -3);
        pIVar3 = pIVar3 + -1;
      } while (*pcVar1 == '\x14');
    }
    if (uVar5 < 0x100) {
      if (0x7f < uVar5) {
        snap_restoredata(J,T,ex,snapno,(ulong)(ushort)*(uint32_t *)&(pIVar2->field_0).op1,ref,
                         (void *)CONCAT44(in_stack_ffffffffffffffdc,4),in_stack_ffffffffffffffe0);
        *pIVar4 = (IRIns)(double)pIVar4->i;
        return;
      }
      pIVar3 = (IRIns *)(&T[1].snap + uVar5);
      if (0xf < uVar5) {
        pIVar3 = (IRIns *)(&T->nextgc + (ulong)(uVar5 - 0x10) * 2);
      }
    }
    else {
      pIVar3 = (IRIns *)((long)&T[2].mcode + (ulong)(uVar5 >> 8) * 4);
      if ((int)dst == 8) {
        uVar5._0_2_ = *(IROpT *)((long)pIVar2 + 4);
        uVar5._2_2_ = *(IRRef1 *)((long)pIVar2 + 6);
        if ((0x604208U >> (uVar5 & 0x1f) & 1) != 0) goto LAB_00146e5f;
        goto LAB_00146e40;
      }
    }
  }
  if ((int)dst == 1) {
    *(undefined1 *)pIVar4 = *(undefined1 *)pIVar3;
    return;
  }
  if ((int)dst != 8) {
    if ((int)dst == 4) {
      (pIVar4->field_1).op12 = (pIVar3->field_1).op12;
      return;
    }
    (pIVar4->field_0).op1 = (IRRef1)*(uint32_t *)&(pIVar3->field_0).op1;
    return;
  }
LAB_00146e5f:
  pIVar4->field_0 = *(anon_struct_8_4_c535eab0_for_IRIns_0 *)pIVar3;
  return;
}

Assistant:

static void snap_restoredata(jit_State *J, GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  UNUSED(J);
  if (irref_isk(ref)) {
    if (ir_isk64(ir)) {
      src = (int32_t *)&ir[1];
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lj_assertJ(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "restore from IR %04d has no reg", ref - REF_BIAS);
	snap_restoredata(J, T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      } else
#endif
      {
	src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
	if (LJ_64 && LJ_BE && sz == 4) src++;
      }
    }
  }
  lj_assertJ(sz == 1 || sz == 2 || sz == 4 || sz == 8,
	     "restore from IR %04d with bad size %d", ref - REF_BIAS, sz);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}